

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_operator.cpp
# Opt level: O2

vector<duckdb::ColumnBinding,_true> *
duckdb::LogicalOperator::MapBindings
          (vector<duckdb::ColumnBinding,_true> *__return_storage_ptr__,
          vector<duckdb::ColumnBinding,_true> *bindings,vector<unsigned_long,_true> *projection_map)

{
  pointer puVar1;
  pointer puVar2;
  size_type *psVar3;
  const_reference __x;
  vector<duckdb::ColumnBinding,_true> *result_bindings;
  size_type *psVar4;
  
  puVar1 = (projection_map->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (projection_map->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 == puVar2) {
    ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::vector
              (&__return_storage_ptr__->
                super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>,
               &bindings->
                super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>);
  }
  else {
    (__return_storage_ptr__->
    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::reserve
              (&__return_storage_ptr__->
                super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>,
               (long)puVar2 - (long)puVar1 >> 3);
    psVar3 = (projection_map->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (psVar4 = (projection_map->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start; psVar4 != psVar3; psVar4 = psVar4 + 1) {
      __x = vector<duckdb::ColumnBinding,_true>::get<true>(bindings,*psVar4);
      ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::push_back
                (&__return_storage_ptr__->
                  super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>,__x);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<ColumnBinding> LogicalOperator::MapBindings(const vector<ColumnBinding> &bindings,
                                                   const vector<idx_t> &projection_map) {
	if (projection_map.empty()) {
		return bindings;
	} else {
		vector<ColumnBinding> result_bindings;
		result_bindings.reserve(projection_map.size());
		for (auto index : projection_map) {
			D_ASSERT(index < bindings.size());
			result_bindings.push_back(bindings[index]);
		}
		return result_bindings;
	}
}